

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxmtoau.c
# Opt level: O0

void puts_uint32_be(uint32_t i)

{
  undefined4 in_EDI;
  char *c;
  undefined1 local_4;
  undefined1 uStack_3;
  undefined1 uStack_2;
  undefined1 uStack_1;
  
  uStack_1 = (char)((uint)in_EDI >> 0x18);
  putchar((int)uStack_1);
  uStack_2 = (char)((uint)in_EDI >> 0x10);
  putchar((int)uStack_2);
  uStack_3 = (char)((uint)in_EDI >> 8);
  putchar((int)uStack_3);
  local_4 = (char)in_EDI;
  putchar((int)local_4);
  return;
}

Assistant:

static void puts_uint32_be(uint32_t i) {
	char* c = (char*)(&i);

	if(XM_BIG_ENDIAN) {
		putchar(c[0]);
		putchar(c[1]);
		putchar(c[2]);
		putchar(c[3]);
	} else {
		putchar(c[3]);
		putchar(c[2]);
		putchar(c[1]);
		putchar(c[0]);
	}
}